

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS580314BA.h
# Opt level: O1

int GetPressureMS580314BA(MS580314BA *pMS580314BA,double *pPressure)

{
  int iVar1;
  ssize_t sVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  unsigned_long D1;
  unsigned_long D2;
  undefined4 local_44;
  unsigned_long local_40;
  unsigned_long local_38;
  timespec local_30;
  
  uVar4 = 0;
  local_40 = 0;
  local_38 = 0;
  local_44 = 0x4201ee54;
  iVar1 = (pMS580314BA->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pMS580314BA->RS232Port).s;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_44 + uVar4),(long)(4 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001bd5d1;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
LAB_001bd5b4:
    local_30.tv_sec = 0;
    local_30.tv_nsec = 10000000;
    nanosleep(&local_30,(timespec *)0x0);
  }
  else {
    if (iVar1 == 0) {
      iVar1 = *(int *)&(pMS580314BA->RS232Port).hDev;
      uVar4 = 0;
      do {
        sVar2 = write(iVar1,(void *)((long)&local_44 + uVar4),(ulong)(4 - (int)uVar4));
        if ((int)sVar2 < 1) goto LAB_001bd5d1;
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < 4);
      goto LAB_001bd5b4;
    }
LAB_001bd5d1:
    puts("Error writing data to a MS580314BA. ");
  }
  local_44 = 0x1ee54;
  iVar1 = (pMS580314BA->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pMS580314BA->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_44 + uVar4),(long)(4 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001bd674;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
LAB_001bd657:
    local_30.tv_sec = 0;
    local_30.tv_nsec = 10000000;
    nanosleep(&local_30,(timespec *)0x0);
  }
  else {
    if (iVar1 == 0) {
      iVar1 = *(int *)&(pMS580314BA->RS232Port).hDev;
      uVar4 = 0;
      do {
        sVar2 = write(iVar1,(void *)((long)&local_44 + uVar4),(ulong)(4 - (int)uVar4));
        if ((int)sVar2 < 1) goto LAB_001bd674;
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < 4);
      goto LAB_001bd657;
    }
LAB_001bd674:
    puts("Error writing data to a MS580314BA. ");
  }
  ReadDataMS580314BA(pMS580314BA,1,&local_40);
  local_44 = 0x5201ee54;
  iVar1 = (pMS580314BA->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pMS580314BA->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_44 + uVar4),(long)(4 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001bd729;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
LAB_001bd70c:
    local_30.tv_sec = 0;
    local_30.tv_nsec = 10000000;
    nanosleep(&local_30,(timespec *)0x0);
  }
  else {
    if (iVar1 == 0) {
      iVar1 = *(int *)&(pMS580314BA->RS232Port).hDev;
      uVar4 = 0;
      do {
        sVar2 = write(iVar1,(void *)((long)&local_44 + uVar4),(ulong)(4 - (int)uVar4));
        if ((int)sVar2 < 1) goto LAB_001bd729;
        uVar3 = (int)uVar4 + (int)sVar2;
        uVar4 = (ulong)uVar3;
      } while (uVar3 < 4);
      goto LAB_001bd70c;
    }
LAB_001bd729:
    puts("Error writing data to a MS580314BA. ");
  }
  local_44 = 0x1ee54;
  iVar1 = (pMS580314BA->RS232Port).DevType;
  if (iVar1 - 1U < 4) {
    iVar1 = (pMS580314BA->RS232Port).s;
    uVar4 = 0;
    do {
      sVar2 = send(iVar1,(void *)((long)&local_44 + uVar4),(long)(4 - (int)uVar4),0);
      if ((int)sVar2 < 1) goto LAB_001bd7cc;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < 4);
  }
  else {
    if (iVar1 != 0) {
LAB_001bd7cc:
      puts("Error writing data to a MS580314BA. ");
      goto LAB_001bd7d8;
    }
    iVar1 = *(int *)&(pMS580314BA->RS232Port).hDev;
    uVar4 = 0;
    do {
      sVar2 = write(iVar1,(void *)((long)&local_44 + uVar4),(ulong)(4 - (int)uVar4));
      if ((int)sVar2 < 1) goto LAB_001bd7cc;
      uVar3 = (int)uVar4 + (int)sVar2;
      uVar4 = (ulong)uVar3;
    } while (uVar3 < 4);
  }
  local_30.tv_sec = 0;
  local_30.tv_nsec = 10000000;
  nanosleep(&local_30,(timespec *)0x0);
LAB_001bd7d8:
  ReadDataMS580314BA(pMS580314BA,1,&local_38);
  auVar6._8_4_ = (int)(local_38 >> 0x20);
  auVar6._0_8_ = local_38;
  auVar6._12_4_ = 0x45300000;
  dVar5 = pMS580314BA->Ca[5] * -256.0 +
          (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)local_38) - 4503599627370496.0);
  dVar8 = pMS580314BA->Ca[6] * dVar5 * 1.1920928955078125e-07 + 2000.0;
  dVar9 = dVar8 + -2000.0;
  if (dVar8 <= 2000.0) {
    dVar10 = dVar9 * 3.0 * dVar9 * 0.5;
    dVar9 = dVar9 * 5.0 * dVar9 * 0.125;
  }
  else {
    dVar10 = dVar9 * dVar9 * 0.0625;
    dVar9 = 0.0;
  }
  if (dVar8 < -1500.0) {
    dVar8 = (dVar8 + 1500.0) * (dVar8 + 1500.0);
    dVar10 = dVar10 + dVar8 * 7.0;
    dVar9 = dVar9 + dVar8 * 4.0;
  }
  if (local_38 != 0 && local_40 != 0) {
    auVar7._8_4_ = (int)(local_40 >> 0x20);
    auVar7._0_8_ = local_40;
    auVar7._12_4_ = 0x45300000;
    *pPressure = (((((auVar7._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0)) *
                    ((dVar5 * pMS580314BA->Ca[3] * 0.00390625 + pMS580314BA->Ca[1] * 32768.0) -
                    dVar9) * 4.76837158203125e-07 -
                   ((pMS580314BA->Ca[4] * dVar5 * 0.0078125 + pMS580314BA->Ca[2] * 65536.0) - dVar10
                   )) * 3.0517578125e-05) / 10.0) / 1000.0;
  }
  pMS580314BA->LastPressure = *pPressure;
  return 0;
}

Assistant:

inline int GetPressureMS580314BA(MS580314BA* pMS580314BA, double* pPressure)
{
	unsigned long D1 = 0, D2 = 0;
	//double tim = 0, ini = 0, fin = 0;
	//double OFF = 0, dt = 0, TEM = 0, P = 0, SENS = 0, T2 = 0, OFF2 = 0, SENS2 = 0, z = 0, zini = 0, TEMPE = 0, Pres = 0, zant = 0;
	double OFF = 0, dt = 0, TEM = 0, P = 0, SENS = 0, T2 = 0, OFF2 = 0, SENS2 = 0, TEMPE = 0, Pres = 0;

	//double depth = Pressure2Height(*pPressure, pMS580314BA->PressureRef, pMS580314BA->WaterDensity); // ...

	// Missing error checking...

	WriteDataMS580314BA(pMS580314BA, 0x42); // Convert D1 (OSR=512)
	WriteDataMS580314BA(pMS580314BA, 0x00);
	ReadDataMS580314BA(pMS580314BA, 1, &D1);

	WriteDataMS580314BA(pMS580314BA, 0x52); // Convert D2 (OSR=512)
	WriteDataMS580314BA(pMS580314BA, 0x00);
	ReadDataMS580314BA(pMS580314BA, 1, &D2);

	dt = D2-pMS580314BA->Ca[5]*256;
	TEM = 2000+dt*pMS580314BA->Ca[6]/8388608;

	OFF = pMS580314BA->Ca[2]*65536;
	OFF = OFF+(pMS580314BA->Ca[4]*dt)/128;

	SENS = pMS580314BA->Ca[1]*32768;
	SENS = SENS+(pMS580314BA->Ca[3]*dt)/256;

	if (TEM <= 2000)
	{
		T2 = 3*(dt*dt);
		T2 = T2/8589934592.0;
		OFF2 = 3*(TEM-2000)*(TEM-2000)/2;
		SENS2 = 5*(TEM-2000)*(TEM-2000)/8;
	}
	else
	{
		T2 = 7*(dt*dt);
		T2 = T2/137438953472.0;
		OFF2 = 1*(TEM-2000)*(TEM-2000)/16;
		SENS2 = 0;
	}

	////Sleep(100);

	if (TEM < -1500)
	{
		OFF2 = OFF2+7*((TEM+1500)*(TEM+1500));
		SENS2 = SENS2+4*((TEM+1500)*(TEM+1500));
	}

	TEM = TEM-T2;
	OFF = OFF-OFF2;
	SENS = SENS-SENS2;

	P = (D1*SENS/2097152-OFF)/32768;

	Pres = P/10.0;
	TEMPE = TEM/100.0;

	//if (tim<1) { zini = (Pres*100)/9810; }
	//if (pMS580314BA->PressureIni == 0) { pMS580314BA->PressureIni = Pres; }

	if ((D1 == 0)||(D2 == 0))
	{
		//depth = depth;
		*pPressure = *pPressure; // ?
	}
	else
	{
		//depth = (Pres*100)/9810-(pMS580314BA->PressureRef*100)/9810;
		//*pPressure = (Pres-pMS580314BA->PressureIni)*(100.0/9810.0)*pMS580314BA->WaterDensity*STANDARD_GRAVITY/1e5;
		*pPressure = Pres/1000.0;
	}

	// ...

	//printf("*pPressure=%f,\n",*pPressure);

	//*pPressure = pMS580314BA->PressureRef-depth*(pMS580314BA->WaterDensity*STANDARD_GRAVITY)/1e5;

	pMS580314BA->LastPressure = *pPressure;

	return EXIT_SUCCESS;
}